

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O0

void __thiscall
ExampleNLFeeder::
FeedColumnSizes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::ColSizeWriter>
          (ExampleNLFeeder *this,ColSizeWriter *csw)

{
  int iVar1;
  ColSizeWriter *in_RSI;
  ExampleNLFeeder *in_RDI;
  int i;
  int in_stack_ffffffffffffffcc;
  ColSizeWriter *this_00;
  int local_14;
  
  iVar1 = mp::NLFeeder<ExampleModel,_void_*>::WantColumnSizes
                    ((NLFeeder<ExampleModel,_void_*> *)in_RDI);
  if (iVar1 != 0) {
    for (local_14 = 0; Model(in_RDI), local_14 < 1; local_14 = local_14 + 1) {
      this_00 = in_RSI;
      Model(in_RDI);
      mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ColSizeWriter::Write
                (this_00,in_stack_ffffffffffffffcc);
    }
  }
  return;
}

Assistant:

void FeedColumnSizes(ColSizeWriter& csw) {
    if (WantColumnSizes())
      for (int i=0; i < Model().n_var-1; ++i)
        csw.Write(Model().col_sizes[i]);
  }